

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

void Gia_ManPrintNodeProfile(int *pCounts,int nSizeMax)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  double dVar4;
  
  if (nSizeMax < 0) {
    uVar3 = 0;
    dVar4 = 0.0;
  }
  else {
    uVar1 = 0;
    uVar3 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (int)uVar1 * pCounts[uVar1];
      uVar3 = uVar3 + pCounts[uVar1];
      uVar1 = uVar1 + 1;
    } while (nSizeMax + 1 != uVar1);
    dVar4 = (double)iVar2;
  }
  Abc_Print(1,"LUT = %d : ",(ulong)uVar3);
  if (1 < nSizeMax) {
    uVar1 = 2;
    do {
      Abc_Print(1,"%d=%d %.1f %%  ",((double)pCounts[uVar1] * 100.0) / (double)(int)uVar3,
                uVar1 & 0xffffffff);
      uVar1 = uVar1 + 1;
    } while (nSizeMax + 1 != uVar1);
  }
  Abc_Print(1,"Ave = %.2f\n",dVar4 / (double)(int)(uVar3 + (uVar3 == 0)));
  return;
}

Assistant:

void Gia_ManPrintNodeProfile( int * pCounts, int nSizeMax )
{
    int i, SizeAll = 0, NodeAll = 0;
    for ( i = 0; i <= nSizeMax; i++ )
    {
        SizeAll += i * pCounts[i];
        NodeAll += pCounts[i];
    }
    Abc_Print( 1, "LUT = %d : ", NodeAll );
    for ( i = 2; i <= nSizeMax; i++ )
        Abc_Print( 1, "%d=%d %.1f %%  ", i, pCounts[i], 100.0*pCounts[i]/NodeAll );
    Abc_Print( 1, "Ave = %.2f\n", 1.0*SizeAll/(NodeAll ? NodeAll : 1) );
}